

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MemoryLeakDetectorTest_memoryCorruption_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_memoryCorruption_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_memoryCorruption_Test *this_00;
  
  this_00 = (TEST_MemoryLeakDetectorTest_memoryCorruption_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x1af);
  TEST_MemoryLeakDetectorTest_memoryCorruption_Test::
  TEST_MemoryLeakDetectorTest_memoryCorruption_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, memoryCorruption)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 10, "ALLOC.c", 10);
    mem[10] = 'O';
    mem[11] = 'H';
    detector->deallocMemory(defaultMallocAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Memory corruption"));
    CHECK(reporter->message->contains("   allocated at file: ALLOC.c line: 10 size: 10 type: malloc"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}